

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

CBlock * GetBlockChecked(CBlock *__return_storage_ptr__,BlockManager *blockman,
                        CBlockIndex *blockindex)

{
  base_blob<256U> *pbVar1;
  bool bVar2;
  UniValue *__return_storage_ptr___00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  undefined1 local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->m_checked_witness_commitment = false;
  __return_storage_ptr__->m_checked_merkle_root = false;
  (__return_storage_ptr__->super_CBlockHeader).nVersion = 0;
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [0] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [1] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [2] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [3] = '\0';
  pbVar1 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[4] = '\0';
  (pbVar1->m_data)._M_elems[5] = '\0';
  (pbVar1->m_data)._M_elems[6] = '\0';
  (pbVar1->m_data)._M_elems[7] = '\0';
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  pbVar1 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  pbVar1 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x14] = '\0';
  (pbVar1->m_data)._M_elems[0x15] = '\0';
  (pbVar1->m_data)._M_elems[0x16] = '\0';
  (pbVar1->m_data)._M_elems[0x17] = '\0';
  (pbVar1->m_data)._M_elems[0x18] = '\0';
  (pbVar1->m_data)._M_elems[0x19] = '\0';
  (pbVar1->m_data)._M_elems[0x1a] = '\0';
  (pbVar1->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
   + 0x1c) = 0;
  pbVar1 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[4] = '\0';
  (pbVar1->m_data)._M_elems[5] = '\0';
  (pbVar1->m_data)._M_elems[6] = '\0';
  (pbVar1->m_data)._M_elems[7] = '\0';
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  pbVar1 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  pbVar1 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x14] = '\0';
  (pbVar1->m_data)._M_elems[0x15] = '\0';
  (pbVar1->m_data)._M_elems[0x16] = '\0';
  (pbVar1->m_data)._M_elems[0x17] = '\0';
  (pbVar1->m_data)._M_elems[0x18] = '\0';
  (pbVar1->m_data)._M_elems[0x19] = '\0';
  (pbVar1->m_data)._M_elems[0x1a] = '\0';
  (pbVar1->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x1c) = 0;
  (__return_storage_ptr__->super_CBlockHeader).nBits = 0;
  (__return_storage_ptr__->super_CBlockHeader).nNonce = 0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(&__return_storage_ptr__->vtx);
  __return_storage_ptr__->fChecked = false;
  __return_storage_ptr__->m_checked_witness_commitment = false;
  __return_storage_ptr__->m_checked_merkle_root = false;
  local_50._0_8_ = &cs_main;
  local_50[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_50);
  CheckBlockDataAvailability(blockman,blockindex,false);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_50);
  bVar2 = node::BlockManager::ReadBlockFromDisk(blockman,__return_storage_ptr__,blockindex);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  else {
    __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Block not found on disk","")
    ;
    JSONRPCError(__return_storage_ptr___00,-1,(string *)local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

static CBlock GetBlockChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlock block;
    {
        LOCK(cs_main);
        CheckBlockDataAvailability(blockman, blockindex, /*check_for_undo=*/false);
    }

    if (!blockman.ReadBlockFromDisk(block, blockindex)) {
        // Block not found on disk. This shouldn't normally happen unless the block was
        // pruned right after we released the lock above.
        throw JSONRPCError(RPC_MISC_ERROR, "Block not found on disk");
    }

    return block;
}